

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O2

void slop_tilde_setup(void)

{
  _class *p_Var1;
  undefined8 in_RAX;
  uint uVar3;
  t_symbol *ptVar2;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  ptVar2 = gensym("slop~");
  slop_tilde_class =
       class_new(ptVar2,slop_tilde_new,(t_method)0x0,0x58,0,A_GIMME,(ulong)uVar3 << 0x20);
  class_domainsignalin(slop_tilde_class,0x30);
  p_Var1 = slop_tilde_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,slop_tilde_dsp,ptVar2,A_CANT,0);
  p_Var1 = slop_tilde_class;
  ptVar2 = gensym("set");
  class_addmethod(p_Var1,slop_tilde_set,ptVar2,A_FLOAT,0);
  return;
}

Assistant:

void slop_tilde_setup(void)
{
    slop_tilde_class = class_new(gensym("slop~"), (t_newmethod)slop_tilde_new, 0,
        sizeof(t_slop_tilde), 0, A_GIMME, 0);
    CLASS_MAINSIGNALIN(slop_tilde_class, t_slop_tilde, x_f);
    class_addmethod(slop_tilde_class, (t_method)slop_tilde_dsp,
        gensym("dsp"), A_CANT, 0);
    class_addmethod(slop_tilde_class, (t_method)slop_tilde_set, gensym("set"),
        A_FLOAT, 0);
}